

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.cpp
# Opt level: O1

vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
* __thiscall
dg::dda::LLVMReadWriteGraphBuilder::mapPointers
          (vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
           *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,Value *where,Value *val,
          Offset size)

{
  type tVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  size_type __n;
  LLVMPointsToSetImpl *pLVar5;
  undefined1 auVar6 [16];
  const_iterator __begin2;
  pair<bool,_dg::LLVMPointsToSet> psn;
  RWNode *ptrNode;
  const_iterator __end2;
  const_iterator local_70;
  char local_68 [8];
  LLVMPointsToSetImpl *local_60;
  Offset local_58;
  RWNode *local_50;
  undefined1 local_48 [8];
  Offset local_40;
  const_iterator local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)this->PTA + 0x10))(local_68,this->PTA,val);
  if ((local_68[0] == '\0') || (lVar4 = (**(code **)(*(long *)local_60 + 0x20))(), lVar4 == 0)) {
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::emplace_back<dg::dda::RWNode*&>
              ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)__return_storage_ptr__,(RWNode **)&UNKNOWN_MEMORY);
  }
  else {
    __n = (**(code **)(*(long *)local_60 + 0x20))();
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
    ::reserve(__return_storage_ptr__,__n);
    cVar2 = (*(code *)**(undefined8 **)local_60)();
    if (cVar2 != '\0') {
      std::
      vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::emplace_back<dg::dda::RWNode*&>
                ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)__return_storage_ptr__,(RWNode **)&UNKNOWN_MEMORY);
    }
    pLVar5 = local_60;
    if ((local_60 != (LLVMPointsToSetImpl *)0x0) &&
       (cVar2 = (**(code **)(*(long *)local_60 + 0x38))(local_60), cVar2 != '\0')) {
      pLVar5 = (LLVMPointsToSetImpl *)0x0;
    }
    local_38.impl = (LLVMPointsToSetImpl *)0x0;
    local_70.impl = pLVar5;
    bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_70,&local_38);
    tVar1 = Offset::UNKNOWN;
    if (!bVar3) {
      do {
        auVar6 = (**(code **)(*(long *)local_70.impl + 0x48))();
        _local_48 = auVar6;
        if (auVar6._0_8_[0x10] != (Value)0x0) {
          local_50 = getOperand(this,auVar6._0_8_);
          local_58.offset = size.offset;
          if (local_40.offset == tVar1) {
            local_58.offset = tVar1;
          }
          std::
          vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
          ::emplace_back<dg::dda::RWNode*&,dg::Offset_const&,dg::Offset>
                    ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                      *)__return_storage_ptr__,&local_50,&local_40,&local_58);
        }
        (**(code **)(*(long *)local_70.impl + 0x40))();
        cVar2 = (**(code **)(*(long *)local_70.impl + 0x38))();
        if (cVar2 != '\0') {
          local_70.impl = (LLVMPointsToSetImpl *)0x0;
        }
        bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_70,&local_38);
      } while (!bVar3);
    }
  }
  if (local_60 != (LLVMPointsToSetImpl *)0x0) {
    (**(code **)(*(long *)local_60 + 0x58))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DefSite>
LLVMReadWriteGraphBuilder::mapPointers(const llvm::Value *where,
                                       const llvm::Value *val, Offset size) {
    std::vector<DefSite> result;

    auto psn = PTA->getLLVMPointsToChecked(val);
    if (!psn.first) {
        result.emplace_back(UNKNOWN_MEMORY);
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "No points-to set for: " << ValInfo(val) << "\n";
#endif
        // don't have points-to information for used pointer
        return result;
    }

    if (psn.second.empty()) {
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "Empty points-to set for: " << ValInfo(val) << "\n";
#endif
        // this may happen on invalid reads and writes to memory,
        // like when you try for example this:
        //
        //   int p, q;
        //   memcpy(p, q, sizeof p);
        //
        // (there should be &p and &q)
        // NOTE: maybe this is a bit strong to say unknown memory,
        // but better be sound then incorrect
        result.emplace_back(UNKNOWN_MEMORY);
        return result;
    }

    result.reserve(psn.second.size());

    if (psn.second.hasUnknown()) {
        result.emplace_back(UNKNOWN_MEMORY);
    }

    for (const auto &ptr : psn.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        RWNode *ptrNode = getOperand(ptr.value);
        if (!ptrNode) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(where) << "\n";
                llvm::errs() << "[RWG] error for " << ValInfo(val) << "\n";
                llvm::errs() << "[RWG] error: Cannot find node for "
                             << ValInfo(ptr.value) << "\n";
            }
            continue;
        }

        // FIXME: we should pass just size to the DefSite ctor, but the old code
        // relies on the behavior that when offset is unknown, the length is
        // also unknown. So for now, mimic the old code. Remove it once we fix
        // the old code.
        result.emplace_back(ptrNode, ptr.offset,
                            ptr.offset.isUnknown() ? Offset::UNKNOWN : size);
    }

    return result;
}